

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_decode_server_name(char **name,uint8_t *src,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  ulong uVar3;
  void *pvVar4;
  char *__dest;
  long lVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *__s;
  bool bVar9;
  
  if ((ulong)((long)end - (long)src) < 2) {
    bVar9 = false;
    iVar6 = 0x32;
    __s = src;
  }
  else {
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar3 = (ulong)src[lVar5] | uVar3 << 8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    __s = src + 2;
    if (((ulong)((long)end - (long)__s) < uVar3) || (iVar6 = 0, uVar3 == 0)) {
      bVar9 = false;
      iVar6 = 0x32;
    }
    else {
      puVar8 = src + uVar3 + 2;
      do {
        puVar1 = __s + 1;
        iVar7 = 6;
        if ((ulong)((long)puVar8 - (long)puVar1) < 2) {
          bVar9 = false;
          iVar6 = 0x32;
          __s = puVar1;
        }
        else {
          uVar2 = *__s;
          lVar5 = 0;
          uVar3 = 0;
          do {
            uVar3 = (ulong)puVar1[lVar5] | uVar3 << 8;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 2);
          __s = __s + 3;
          bVar9 = false;
          if ((ulong)((long)puVar8 - (long)__s) < uVar3) {
            iVar6 = 0x32;
          }
          else {
            bVar9 = true;
            if (uVar2 == '\0') {
              pvVar4 = memchr(__s,0,uVar3);
              if (pvVar4 == (void *)0x0) {
                iVar7 = 6;
                if (*name != (char *)0x0) {
                  bVar9 = false;
                  iVar6 = 0x2f;
                  goto LAB_00112583;
                }
                __dest = (char *)malloc(uVar3 + 1);
                *name = __dest;
                if (__dest != (char *)0x0) {
                  memcpy(__dest,__s,uVar3);
                  __dest[uVar3] = '\0';
                  goto LAB_00112542;
                }
                iVar6 = 0x201;
              }
              else {
                iVar6 = 0x2f;
              }
              bVar9 = false;
              iVar7 = 6;
            }
            else {
LAB_00112542:
              iVar7 = 0;
              __s = __s + uVar3;
            }
          }
        }
LAB_00112583:
        if (!bVar9) goto LAB_001125dd;
      } while (__s != puVar8);
      iVar7 = 0;
LAB_001125dd:
      bVar9 = iVar7 == 0;
    }
  }
  iVar7 = 0x32;
  if (__s == end) {
    iVar7 = iVar6;
  }
  if (!bVar9) {
    iVar7 = iVar6;
  }
  return iVar7;
}

Assistant:

static int client_hello_decode_server_name(char **name, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *src++;
            decode_open_block(src, end, 2, {
                if (type == 0) {
                    if (memchr(src, '\0', end - src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    if (*name != NULL) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    if ((*name = malloc(end - src + 1)) == NULL) {
                        ret = PTLS_ERROR_NO_MEMORY;
                        goto Exit;
                    }
                    memcpy(*name, src, end - src);
                    (*name)[end - src] = '\0';
                }
                src = end;
            });
        } while (src != end);
    });

Exit:
    return ret;
}